

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

ssize_t __thiscall
phosg::StringReader::read(StringReader *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  __off_t in_R8;
  
  sVar1 = pread(this,(int)this->offset,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf,
                in_R8);
  if (sVar1 != 0 && (char)__nbytes == '\x01') {
    this->offset = this->offset + sVar1;
  }
  return sVar1;
}

Assistant:

size_t StringReader::read(void* data, size_t size, bool advance) {
  size_t ret = this->pread(this->offset, data, size);
  if (ret && advance) {
    this->offset += ret;
  }
  return ret;
}